

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O3

void __thiscall Omega_take_drop_Test::TestBody(Omega_take_drop_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  __type t2;
  __type t1;
  AssertHelper local_68;
  AssertHelper local_60;
  undefined1 local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  _Head_base<1UL,_const_char_*,_false> local_48;
  _Head_base<0UL,_int,_false> local_40;
  _Tuple_impl<0UL,_int,_int> local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 local_28 [16];
  _Head_base<1UL,_const_char_*,_false> local_18;
  _Head_base<0UL,_int,_false> local_10;
  
  local_28._0_8_ = &DAT_4025000000000000;
  local_28._8_8_ = &DAT_800000009;
  local_18._M_head_impl = "yuppi!";
  local_10._M_head_impl = 7;
  local_58 = (undefined1  [8])&DAT_4025000000000000;
  local_50.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_800000009;
  local_48._M_head_impl = "yuppi!";
  local_40._M_head_impl = 7;
  testing::internal::
  CmpHelperEQ<std::tuple<int,char_const*,int,int,double>,std::tuple<int,char_const*,int,int,double>>
            ((internal *)&local_38,"t1","std::make_tuple(7, \"yuppi!\", 8, 9, 10.5)",
             (tuple<int,_const_char_*,_int,_int,_double> *)local_28,
             (tuple<int,_const_char_*,_int,_int,_double> *)local_58);
  if ((char)local_38.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl ==
      '\0') {
    testing::Message::Message((Message *)local_58);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38 = (_Tuple_impl<0UL,_int,_int>)&DAT_500000006;
  local_68.data_ = (AssertHelperData *)&DAT_500000006;
  testing::internal::CmpHelperEQ<std::tuple<int,int>,std::tuple<int,int>>
            ((internal *)local_58,"t2","std::make_tuple(5, 6)",(tuple<int,_int> *)&local_38,
             (tuple<int,_int> *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Omega, take_drop)
{
    const auto t1 = omega::drop<2>(t);
    EXPECT_EQ (t1, std::make_tuple(7, "yuppi!", 8, 9, 10.5));

    const auto t2 = omega::take<2>(t);
    EXPECT_EQ (t2, std::make_tuple(5, 6));
}